

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O3

void __thiscall Args::CmdLine::parse(CmdLine *this)

{
  ulong uVar1;
  pointer *pppCVar2;
  pointer pcVar3;
  pointer ppCVar4;
  pointer puVar5;
  iterator iVar6;
  size_type sVar7;
  size_type sVar8;
  char cVar9;
  int iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined8 uVar12;
  iterator iVar13;
  long lVar14;
  ArgIface *pAVar15;
  undefined8 *puVar16;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var17;
  undefined4 extraout_var;
  logic_error *plVar18;
  long *plVar19;
  size_type *psVar20;
  ulong *puVar21;
  _Alloc_hider _Var22;
  byte bVar23;
  Command *pCVar24;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  pointer puVar25;
  pointer ppCVar26;
  ulong uVar27;
  String value;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> tmpArgs;
  String word;
  ArgIface *tmp;
  ArgIface *arg_1;
  anon_class_24_3_c2b40766 check;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  value_type local_170;
  uint local_14c;
  CmdLine *local_148;
  undefined8 local_140;
  Context *local_138;
  long local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  String local_108;
  ulong *local_e8;
  long local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Command **local_c8;
  Command **local_c0;
  Command *local_b8;
  vector<Args::Command*,std::allocator<Args::Command*>> *local_b0;
  ulong *local_a8;
  long local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  anon_class_24_3_c2b40766 local_48;
  
  clear(this);
  checkCorrectnessBeforeParsing(this);
  pbVar11 = (this->m_context).m_it._M_current;
  if (pbVar11 !=
      (this->m_context).m_context.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_138 = &this->m_context;
    local_b0 = (vector<Args::Command*,std::allocator<Args::Command*>> *)&this->m_prevCommand;
    local_c0 = &this->m_currCommand;
    local_c8 = &this->m_command;
    local_148 = this;
    do {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      (this->m_context).m_it._M_current = pbVar11 + 1;
      pcVar3 = (pbVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar3,pcVar3 + pbVar11->_M_string_length);
      cVar9 = (char)&local_108;
      local_130 = std::__cxx11::string::find(cVar9,0x3d);
      if (local_130 == -1) {
        local_140 = 0;
      }
      else {
        uVar12 = std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_108);
        local_140 = CONCAT71((int7)((ulong)uVar12 >> 8),local_170._M_string_length != 0);
        if (local_170._M_string_length != 0) {
          iVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(&local_138->m_context,(this->m_context).m_it._M_current,&local_170);
          (this->m_context).m_it._M_current = iVar13._M_current;
        }
        std::__cxx11::string::substr((ulong)&local_1b0,(ulong)&local_108);
        std::__cxx11::string::operator=((string *)&local_108,(string *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
      }
      lVar14 = std::__cxx11::string::find((char *)&local_108,0x112586,0);
      if (lVar14 == 0) {
        pAVar15 = findArgument(this,&local_108);
        if (pAVar15 == (ArgIface *)0x0) {
          if ((this->m_opt & 2) == 0) {
            printInfoAboutUnknownArgument(this,&local_108);
          }
          else {
            savePositionalArguments(this,&local_108,local_130 != -1,local_140._0_1_);
          }
        }
        else {
          (*pAVar15->_vptr_ArgIface[0xf])(pAVar15,local_138);
        }
      }
      else {
        lVar14 = std::__cxx11::string::find((char *)&local_108,0x112586,0);
        if ((lVar14 == 0) ||
           (lVar14 = std::__cxx11::string::find(cVar9,0x2d), sVar8 = local_108._M_string_length,
           lVar14 != 0)) {
          local_b8 = (Command *)findArgument(this,&local_108);
          local_48.tmp = (ArgIface **)&local_b8;
          local_48.this = this;
          local_48.word = &local_108;
          if ((local_b8 == (Command *)0x0) ||
             (iVar10 = (*(local_b8->super_GroupIface).super_ArgIface._vptr_ArgIface[2])(local_b8),
             iVar10 != 0)) {
            if ((this->m_opt & 2) == 0) {
              printInfoAboutUnknownArgument(this,&local_108);
            }
            else {
              savePositionalArguments(this,&local_108,local_130 != -1,local_140._0_1_);
            }
          }
          else {
            ppCVar4 = (this->m_prevCommand).
                      super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (ppCVar26 = (this->m_prevCommand).
                            super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
                            _M_impl.super__Vector_impl_data._M_start; ppCVar26 != ppCVar4;
                ppCVar26 = ppCVar26 + 1) {
              pCVar24 = *ppCVar26;
              _Var17 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_pred<Args::CmdLine::parse()::_lambda(auto:1_const&)_1_>>
                                 ((pCVar24->super_GroupIface).m_children.
                                  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pCVar24->super_GroupIface).m_children.
                                  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
              if (_Var17._M_current !=
                  (pCVar24->super_GroupIface).m_children.
                  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pCVar24 = *local_c0;
                do {
                  puVar5 = (pCVar24->super_GroupIface).m_children.
                           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (puVar25 = (pCVar24->super_GroupIface).m_children.
                                 super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar5;
                      puVar25 = puVar25 + 1) {
                    pAVar15 = (puVar25->_M_t).
                              super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>
                              .super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
                    iVar10 = (*pAVar15->_vptr_ArgIface[0xe])(pAVar15,&local_108);
                    if (CONCAT44(extraout_var,iVar10) != 0) goto LAB_001059db;
                  }
                  pCVar24 = pCVar24->m_subCommand;
                  if (pCVar24 == (Command *)0x0) {
                    plVar18 = (logic_error *)__cxa_allocate_exception(0x30);
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_128,
                               "Only one command from one level can be specified. But you defined \""
                               ,"");
                    std::operator+(&local_190,&local_128,&local_108);
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_190);
                    local_1b0._M_dataplus._M_p = (pointer)*plVar19;
                    psVar20 = (size_type *)(plVar19 + 2);
                    if ((size_type *)local_1b0._M_dataplus._M_p == psVar20) {
                      local_1b0.field_2._M_allocated_capacity = *psVar20;
                      local_1b0.field_2._8_4_ = (undefined4)plVar19[3];
                      local_1b0.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
                      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                    }
                    else {
                      local_1b0.field_2._M_allocated_capacity = *psVar20;
                    }
                    local_1b0._M_string_length = plVar19[1];
                    *plVar19 = (long)psVar20;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    (*((*ppCVar26)->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_68);
                    std::operator+(&local_170,&local_1b0,&local_68);
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_170);
                    local_e8 = (ulong *)*plVar19;
                    puVar21 = (ulong *)(plVar19 + 2);
                    if (local_e8 == puVar21) {
                      local_d8 = *puVar21;
                      uStack_d0 = plVar19[3];
                      local_e8 = &local_d8;
                    }
                    else {
                      local_d8 = *puVar21;
                    }
                    local_e0 = plVar19[1];
                    *plVar19 = (long)puVar21;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    std::logic_error::logic_error
                              (plVar18,"Please use desc() method of the exception.");
                    *(undefined ***)plVar18 = &PTR__BaseException_00118ba0;
                    *(logic_error **)(plVar18 + 0x10) = plVar18 + 0x20;
                    if (local_e8 == &local_d8) {
                      *(undefined4 *)(plVar18 + 0x20) = (undefined4)local_d8;
                      *(undefined4 *)(plVar18 + 0x24) = local_d8._4_4_;
                      *(undefined4 *)(plVar18 + 0x28) = (undefined4)uStack_d0;
                      *(undefined4 *)(plVar18 + 0x2c) = uStack_d0._4_4_;
                    }
                    else {
                      *(ulong **)(plVar18 + 0x10) = local_e8;
                      *(ulong *)(plVar18 + 0x20) = local_d8;
                    }
                    *(long *)(plVar18 + 0x18) = local_e0;
                    local_e8 = &local_d8;
                    local_e0 = 0;
                    local_d8 = local_d8 & 0xffffffffffffff00;
                    __cxa_throw(plVar18,&BaseException::typeinfo,BaseException::~BaseException);
                  }
                } while( true );
              }
LAB_001059db:
            }
            parse::anon_class_24_3_c2b40766::operator()(&local_48);
            this = local_148;
            if (*local_c8 == (Command *)0x0) {
              local_148->m_command = local_b8;
              local_148->m_currCommand = local_b8;
              iVar6._M_current =
                   (local_148->m_prevCommand).
                   super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (local_148->m_prevCommand).
                  super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Args::Command*,std::allocator<Args::Command*>>::
                _M_realloc_insert<Args::Command*const&>(local_b0,iVar6,local_c8);
              }
              else {
                *iVar6._M_current = local_b8;
                pppCVar2 = &(local_148->m_prevCommand).
                            super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppCVar2 = *pppCVar2 + 1;
              }
              (*((*local_c8)->super_GroupIface).super_ArgIface._vptr_ArgIface[0xf])
                        (*local_c8,local_138);
            }
            else {
              local_148->m_currCommand->m_subCommand = local_b8;
              local_148->m_currCommand = local_b8;
              iVar6._M_current =
                   (local_148->m_prevCommand).
                   super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (local_148->m_prevCommand).
                  super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Args::Command*,std::allocator<Args::Command*>>::
                _M_realloc_insert<Args::Command*const&>(local_b0,iVar6,local_c0);
              }
              else {
                *iVar6._M_current = local_b8;
                pppCVar2 = &(local_148->m_prevCommand).
                            super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppCVar2 = *pppCVar2 + 1;
              }
              (*((*local_c0)->super_GroupIface).super_ArgIface._vptr_ArgIface[0xf])
                        (*local_c0,local_138);
            }
          }
        }
        else {
          local_128._M_dataplus._M_p = (pointer)0x0;
          local_128._M_string_length = 0;
          local_128.field_2._M_allocated_capacity = 0;
          if (1 < local_108._M_string_length) {
            uVar1 = local_108._M_string_length - 1;
            uVar27 = 1;
            local_14c = 0;
            do {
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"-","");
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_190,'\x01');
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                uVar12 = local_1b0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < local_190._M_string_length + local_1b0._M_string_length) {
                uVar12 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_190._M_dataplus._M_p != &local_190.field_2) {
                  uVar12 = local_190.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar12 < local_190._M_string_length + local_1b0._M_string_length)
                goto LAB_00105794;
                puVar16 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_190,0,(char *)0x0,
                                     (ulong)local_1b0._M_dataplus._M_p);
              }
              else {
LAB_00105794:
                puVar16 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_1b0,(ulong)local_190._M_dataplus._M_p);
              }
              psVar20 = puVar16 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar20) {
                local_170.field_2._M_allocated_capacity = *psVar20;
                local_170.field_2._8_8_ = puVar16[3];
                local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              }
              else {
                local_170.field_2._M_allocated_capacity = *psVar20;
                local_170._M_dataplus._M_p = (pointer)*puVar16;
              }
              local_170._M_string_length = puVar16[1];
              *puVar16 = psVar20;
              puVar16[1] = 0;
              *(undefined1 *)psVar20 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p,
                                local_1b0.field_2._M_allocated_capacity + 1);
              }
              local_68._M_dataplus._M_p = (pointer)findArgument(local_148,&local_170);
              if ((ArgIface *)local_68._M_dataplus._M_p == (ArgIface *)0x0) {
                if ((local_148->m_opt & 2) == 0) {
                  plVar18 = (logic_error *)__cxa_allocate_exception(0x30);
                  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_190,"Unknown argument \"","");
                  std::operator+(&local_1b0,&local_190,&local_170);
                  plVar19 = (long *)std::__cxx11::string::append((char *)&local_1b0);
                  local_88 = (ulong *)*plVar19;
                  puVar21 = (ulong *)(plVar19 + 2);
                  if (local_88 == puVar21) {
                    local_78 = *puVar21;
                    uStack_70 = plVar19[3];
                    local_88 = &local_78;
                  }
                  else {
                    local_78 = *puVar21;
                  }
                  local_80 = plVar19[1];
                  *plVar19 = (long)puVar21;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  std::logic_error::logic_error
                            (plVar18,"Please use desc() method of the exception.");
                  *(undefined ***)plVar18 = &PTR__BaseException_00118ba0;
                  *(logic_error **)(plVar18 + 0x10) = plVar18 + 0x20;
                  if (local_88 == &local_78) {
                    *(undefined4 *)(plVar18 + 0x20) = (undefined4)local_78;
                    *(undefined4 *)(plVar18 + 0x24) = local_78._4_4_;
                    *(undefined4 *)(plVar18 + 0x28) = (undefined4)uStack_70;
                    *(undefined4 *)(plVar18 + 0x2c) = uStack_70._4_4_;
                  }
                  else {
                    *(ulong **)(plVar18 + 0x10) = local_88;
                    *(ulong *)(plVar18 + 0x20) = local_78;
                  }
                  *(long *)(plVar18 + 0x18) = local_80;
                  local_80 = 0;
                  local_78 = local_78 & 0xffffffffffffff00;
                  local_88 = &local_78;
                  __cxa_throw(plVar18,&BaseException::typeinfo,BaseException::~BaseException);
                }
LAB_001058b2:
                local_14c = (uint)CONCAT71((int7)((ulong)local_148 >> 8),1);
                bVar23 = 0;
              }
              else {
                if (local_128._M_string_length == local_128.field_2._M_allocated_capacity) {
                  std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>::
                  _M_realloc_insert<Args::ArgIface*const&>
                            ((vector<Args::ArgIface*,std::allocator<Args::ArgIface*>> *)&local_128,
                             (iterator)local_128._M_string_length,(ArgIface **)&local_68);
                }
                else {
                  *(pointer *)local_128._M_string_length = local_68._M_dataplus._M_p;
                  local_128._M_string_length = local_128._M_string_length + 8;
                }
                if ((uVar27 < uVar1) &&
                   (cVar9 = (**(code **)(*(long *)local_68._M_dataplus._M_p + 0x20))(),
                   cVar9 != '\0')) {
                  if ((local_148->m_opt & 2) == 0) {
                    plVar18 = (logic_error *)__cxa_allocate_exception(0x30);
                    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_190,
                               "Only last argument in flags combo can be with value. Flags combo is \""
                               ,"");
                    std::operator+(&local_1b0,&local_190,&local_108);
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1b0);
                    local_a8 = (ulong *)*plVar19;
                    puVar21 = (ulong *)(plVar19 + 2);
                    if (local_a8 == puVar21) {
                      local_98 = *puVar21;
                      uStack_90 = plVar19[3];
                      local_a8 = &local_98;
                    }
                    else {
                      local_98 = *puVar21;
                    }
                    local_a0 = plVar19[1];
                    *plVar19 = (long)puVar21;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    std::logic_error::logic_error
                              (plVar18,"Please use desc() method of the exception.");
                    *(undefined ***)plVar18 = &PTR__BaseException_00118ba0;
                    *(logic_error **)(plVar18 + 0x10) = plVar18 + 0x20;
                    if (local_a8 == &local_98) {
                      *(undefined4 *)(plVar18 + 0x20) = (undefined4)local_98;
                      *(undefined4 *)(plVar18 + 0x24) = local_98._4_4_;
                      *(undefined4 *)(plVar18 + 0x28) = (undefined4)uStack_90;
                      *(undefined4 *)(plVar18 + 0x2c) = uStack_90._4_4_;
                    }
                    else {
                      *(ulong **)(plVar18 + 0x10) = local_a8;
                      *(ulong *)(plVar18 + 0x20) = local_98;
                    }
                    *(long *)(plVar18 + 0x18) = local_a0;
                    local_a0 = 0;
                    local_98 = local_98 & 0xffffffffffffff00;
                    local_a8 = &local_98;
                    __cxa_throw(plVar18,&BaseException::typeinfo,BaseException::~BaseException);
                  }
                  goto LAB_001058b2;
                }
                bVar23 = 1;
                (**(code **)(*(long *)local_68._M_dataplus._M_p + 0x78))
                          (local_68._M_dataplus._M_p,local_138);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              sVar7 = local_128._M_string_length;
              this = local_148;
              uVar27 = uVar27 + 1;
            } while ((bool)(bVar23 & uVar27 < sVar8));
            if (((local_14c & 1) != 0) &&
               (_Var22._M_p = local_128._M_dataplus._M_p, (local_148->m_opt & 2) != 0)) {
              for (; _Var22._M_p != (pointer)sVar7; _Var22._M_p = (pointer)((long)_Var22._M_p + 8))
              {
                (*(*(ArgIface **)_Var22._M_p)->_vptr_ArgIface[0xd])();
              }
              savePositionalArguments(this,&local_108,local_130 != -1,local_140._0_1_);
            }
          }
          if ((ArgIface **)local_128._M_dataplus._M_p != (ArgIface **)0x0) {
            operator_delete(local_128._M_dataplus._M_p,
                            local_128.field_2._M_allocated_capacity -
                            (long)local_128._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      pbVar11 = (this->m_context).m_it._M_current;
    } while (pbVar11 !=
             (this->m_context).m_context.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  checkCorrectnessAfterParsing(this);
  return;
}

Assistant:

inline void
CmdLine::parse()
{
	clear();

	checkCorrectnessBeforeParsing();

	while( !m_context.atEnd() )
	{
		String word = *m_context.next();

		const String::size_type eqIt = word.find( '=' );

		bool splitted = false;
		bool valuePrepended = false;

		if( eqIt != String::npos )
		{
			splitted = true;

			const String value = word.substr( eqIt + 1 );

			if( !value.empty() )
			{
				valuePrepended = true;
				m_context.prepend( value );
			}

			word = word.substr( 0, eqIt );
		}

		if( details::isArgument( word ) )
		{
			auto * arg = findArgument( word );

			if( arg )
				arg->process( m_context );
			else if( m_opt & HandlePositionalArguments )
				savePositionalArguments( word, splitted, valuePrepended );
			else
				printInfoAboutUnknownArgument( word );
		}
		else if( details::isFlag( word ) )
		{
			std::vector< ArgIface* > tmpArgs;
			bool failed = false;

			for( String::size_type i = 1, length = word.length(); i < length; ++i )
			{
				const String flag = String( SL( "-" ) ) +

#ifdef ARGS_QSTRING_BUILD
					String( word[ i ] );
#else
					String( 1, word[ i ] );
#endif

				auto * arg = findArgument( flag );

				if( !arg )
				{
					failed = true;

					if( !( m_opt & HandlePositionalArguments ) )
						throw BaseException( String( SL( "Unknown argument \"" ) ) +
							flag + SL( "\"." ) );
					else
						break;
				}
				else
					tmpArgs.push_back( arg );

				if( i < length - 1 && arg->isWithValue() )
				{
					failed = true;

					if( !( m_opt & HandlePositionalArguments ) )
						throw BaseException( String( SL( "Only last argument in "
							"flags combo can be with value. Flags combo is \"" ) ) +
							word + SL( "\"." ) );
					else
						break;
				}
				else
					arg->process( m_context );
			}

			if( failed && ( m_opt & HandlePositionalArguments ) )
			{
				for( auto * a : tmpArgs )
					a->clear();

				savePositionalArguments( word, splitted, valuePrepended );
			}
		}
		// Command?
		else
		{
			auto * tmp = findArgument( word );

			auto check = [this, &tmp, &word] ()
			{
				const auto & args = m_args;

				const auto it = std::find_if( args.cbegin(),
					args.cend(), [&tmp] ( const auto & arg ) -> bool
						{ return ( arg.get() == tmp ); } );

				if( m_command && it != args.cend() && !m_command->findChild( word ) )
					throw BaseException( String( SL(
							"Only one command from one level can be specified. "
							"But you defined \"" ) ) +
						word + SL( "\" and \"" ) + m_command->name() + SL( "\"." ) );
			};

			if( tmp )
			{
				if( tmp->type() == ArgType::Command )
				{
					bool stopProcessing = false;

					try {
						if( !m_prevCommand.empty() )
						{
							for( const auto & prev : m_prevCommand )
							{
								const auto & args = prev->children();

								const auto it = std::find_if( args.cbegin(),
									args.cend(), [&tmp] ( const auto & arg ) -> bool
										{ return ( arg.get() == tmp ); } );

								if( it != args.cend() && !m_currCommand->findChild( word ) )
									throw BaseException( String( SL(
											"Only one command from one level can be specified. "
											"But you defined \"" ) ) +
										word + SL( "\" and \"" ) + prev->name() + SL( "\"." ) );
							}

							check();
						}
						else
							check();
					}
					catch( const BaseException & )
					{
						if( m_opt & HandlePositionalArguments )
						{
							savePositionalArguments( word, splitted, valuePrepended );

							stopProcessing = true;
						}
						else
							throw;
					}

					if( stopProcessing )
						continue;

					if( !m_command )
					{
						m_command = static_cast< Command* > ( tmp );

						m_currCommand = m_command;

						m_prevCommand.push_back( m_command );

						m_command->process( m_context );
					}
					else
					{
						auto * cmd = static_cast< Command* > ( tmp );

						m_currCommand->setCurrentSubCommand( cmd );

						m_currCommand = cmd;

						m_prevCommand.push_back( m_currCommand );

						m_currCommand->process( m_context );
					}
				}
				else if( m_opt & HandlePositionalArguments )
					savePositionalArguments( word, splitted, valuePrepended );
				else
					printInfoAboutUnknownArgument( word );
			}
			else if( m_opt & HandlePositionalArguments )
				savePositionalArguments( word, splitted, valuePrepended );
			else
				printInfoAboutUnknownArgument( word );
		}
	}

	checkCorrectnessAfterParsing();
}